

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Expression * __thiscall
ot::commissioner::Interpreter::Read_abi_cxx11_(Expression *__return_storage_ptr__,Interpreter *this)

{
  string local_30;
  
  Console::Read_abi_cxx11_();
  ParseExpression(__return_storage_ptr__,this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Expression Interpreter::Read()
{
    return ParseExpression(Console::Read());
}